

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool __thiscall ON_Extrusion::GetProfilePlane(ON_Extrusion *this,double s,ON_Plane *plane)

{
  double *pdVar1;
  double t;
  bool bVar2;
  undefined1 local_1a0 [8];
  ON_Xform xform;
  double dStack_118;
  double local_110;
  ON_3dVector local_108;
  undefined4 local_ec;
  ON_3dVector local_e8;
  ON_3dVector local_c0;
  undefined1 auStack_a8 [8];
  ON_Plane p;
  ON_Plane *plane_local;
  double s_local;
  ON_Extrusion *this_local;
  
  p.plane_equation.d = (double)plane;
  ON_Plane::ON_Plane((ON_Plane *)auStack_a8);
  p.origin.y = ON_3dPoint::Origin.z;
  auStack_a8 = (undefined1  [8])ON_3dPoint::Origin.x;
  p.origin.x = ON_3dPoint::Origin.y;
  PathTangent(&local_c0,this);
  p.zaxis.y = local_c0.z;
  p.yaxis.z = local_c0.x;
  p.zaxis.x = local_c0.y;
  p.yaxis.y = (this->m_up).z;
  p.xaxis.z = (this->m_up).x;
  p.yaxis.x = (this->m_up).y;
  ON_CrossProduct(&local_e8,(ON_3dVector *)&p.xaxis.z,(ON_3dVector *)&p.yaxis.z);
  p.xaxis.y = local_e8.z;
  p.origin.z = local_e8.x;
  p.xaxis.x = local_e8.y;
  bVar2 = ON_3dVector::Unitize((ON_3dVector *)&p.origin.z);
  if (bVar2) {
    bVar2 = ON_3dVector::Unitize((ON_3dVector *)&p.xaxis.z);
    if (bVar2) {
      ON_Plane::UpdateEquation((ON_Plane *)auStack_a8);
      bVar2 = ON_Plane::IsValid((ON_Plane *)auStack_a8);
      if (!bVar2) {
        ON_CrossProduct(&local_108,(ON_3dVector *)&p.yaxis.z,(ON_3dVector *)&p.origin.z);
        p.yaxis.y = local_108.z;
        p.xaxis.z = local_108.x;
        p.yaxis.x = local_108.y;
        ON_3dVector::Unitize((ON_3dVector *)&p.xaxis.z);
        bVar2 = ON_Plane::IsValid((ON_Plane *)auStack_a8);
        if (!bVar2) {
          this_local._7_1_ = false;
          goto LAB_004e90cb;
        }
      }
      if ((((this->m_bHaveN[0] & 1U) != 0) &&
          ((((this->m_N[0].x != 0.0 || (NAN(this->m_N[0].x))) ||
            (pdVar1 = &this->m_N[0].y, *pdVar1 != 0.0)) || (NAN(*pdVar1))))) ||
         (((this->m_bHaveN[1] & 1U) != 0 &&
          (((this->m_N[1].x != 0.0 || (NAN(this->m_N[1].x))) ||
           ((pdVar1 = &this->m_N[1].y, *pdVar1 != 0.0 || (NAN(*pdVar1))))))))) {
        ON_Xform::ON_Xform((ON_Xform *)local_1a0);
        bVar2 = GetProfileTransformation(this,s,(ON_Xform *)local_1a0);
        if (!bVar2) {
          this_local._7_1_ = false;
          goto LAB_004e90cb;
        }
        bVar2 = ON_Plane::Transform((ON_Plane *)auStack_a8,(ON_Xform *)local_1a0);
        if (!bVar2) {
          this_local._7_1_ = false;
          goto LAB_004e90cb;
        }
        memcpy((void *)p.plane_equation.d,auStack_a8,0x80);
      }
      else {
        t = ON_Interval::ParameterAt(&this->m_t,s);
        ON_Line::PointAt((ON_3dPoint *)(xform.m_xform[3] + 3),&this->m_path,t);
        p.origin.y = local_110;
        auStack_a8 = (undefined1  [8])xform.m_xform[3][3];
        p.origin.x = dStack_118;
        ON_Plane::UpdateEquation((ON_Plane *)auStack_a8);
        memcpy((void *)p.plane_equation.d,auStack_a8,0x80);
      }
      this_local._7_1_ = ON_Plane::IsValid((ON_Plane *)p.plane_equation.d);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_004e90cb:
  local_ec = 1;
  ON_Plane::~ON_Plane((ON_Plane *)auStack_a8);
  return this_local._7_1_;
}

Assistant:

bool ON_Extrusion::GetProfilePlane( double s, ON_Plane& plane ) const
{
  ON_Plane p;
  p.origin = ON_3dPoint::Origin;
  p.zaxis = PathTangent();
  p.yaxis = m_up;
  p.xaxis = ON_CrossProduct(p.yaxis,p.zaxis);
  if ( !p.xaxis.Unitize() )
    return false;
  if ( !p.yaxis.Unitize() )
    return false;
  p.UpdateEquation();
  if ( !p.IsValid() )
  {
    p.yaxis = ON_CrossProduct(p.zaxis,p.xaxis);
    p.yaxis.Unitize();
    if ( !p.IsValid() )
      return false;
  }
  if (    (!m_bHaveN[0] || (0.0 == m_N[0].x && 0.0 == m_N[0].y)) 
       && (!m_bHaveN[1] || (0.0 == m_N[1].x && 0.0 == m_N[1].y)) 
     )
  {
    p.origin = m_path.PointAt(m_t.ParameterAt(s));
    p.UpdateEquation();
    plane = p;
  }
  else
  {
    ON_Xform xform;
    if ( !GetProfileTransformation(s,xform) )
      return false;
    if (!p.Transform(xform))
      return false;
    plane = p;
  }
  return plane.IsValid();
}